

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O2

void COST_SENSITIVE::print_update
               (vw *all,bool is_test,example *ec,multi_ex *ec_seq,bool action_scores,
               uint32_t prediction)

{
  bool holdout_set_off;
  shared_data *psVar1;
  namedlabels *this;
  size_t current_pass;
  example **ecc;
  pointer ppeVar2;
  size_t num_features;
  string local_1e0;
  string label_buf;
  ostringstream pred_buf;
  undefined8 uStack_190;
  uint auStack_188 [88];
  
  psVar1 = all->sd;
  if (psVar1->weighted_labeled_examples + psVar1->weighted_unlabeled_examples <
      (double)psVar1->dump_interval) {
    return;
  }
  if (all->quiet != false) {
    return;
  }
  if (all->bfgs != false) {
    return;
  }
  if (ec_seq == (multi_ex *)0x0) {
    num_features = ec->num_features;
  }
  else {
    num_features = 0;
    for (ppeVar2 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        ppeVar2 !=
        (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppeVar2 = ppeVar2 + 1) {
      num_features = num_features + (*ppeVar2)->num_features;
    }
  }
  label_buf._M_dataplus._M_p = (pointer)&label_buf.field_2;
  label_buf._M_string_length = 0;
  label_buf.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&label_buf);
  if ((!action_scores) && (all->sd->ldict == (namedlabels *)0x0)) {
    shared_data::print_update
              (all->sd,all->holdout_set_off,all->current_pass,&label_buf,prediction,num_features,
               all->progress_add,all->progress_arg);
    goto LAB_00229bf1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pred_buf);
  *(undefined8 *)((long)&uStack_190 + *(long *)(_pred_buf + -0x18)) = 8;
  *(uint *)((long)auStack_188 + *(long *)(_pred_buf + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(_pred_buf + -0x18)) & 0xffffff4f | 0x80;
  std::operator<<(&pred_buf,0x20);
  this = all->sd->ldict;
  if (this == (namedlabels *)0x0) {
    std::ostream::_M_insert<unsigned_long>((ulong)&pred_buf);
    if (action_scores) goto LAB_00229b62;
  }
  else if (action_scores) {
    local_1e0._0_16_ = namedlabels::get(this,((ec->pred).a_s._begin)->action);
    ::operator<<((ostream *)&pred_buf,(substring *)&local_1e0);
LAB_00229b62:
    std::operator<<((ostream *)&pred_buf,".....");
  }
  else {
    local_1e0._0_16_ = namedlabels::get(this,prediction);
    ::operator<<((ostream *)&pred_buf,(substring *)&local_1e0);
  }
  psVar1 = all->sd;
  current_pass = all->current_pass;
  holdout_set_off = all->holdout_set_off;
  std::__cxx11::stringbuf::str();
  shared_data::print_update
            (psVar1,holdout_set_off,current_pass,&label_buf,&local_1e0,num_features,
             all->progress_add,all->progress_arg);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pred_buf);
LAB_00229bf1:
  std::__cxx11::string::~string((string *)&label_buf);
  return;
}

Assistant:

void print_update(vw& all, bool is_test, example& ec, multi_ex* ec_seq, bool action_scores, uint32_t prediction)
{
  if (all.sd->weighted_examples() >= all.sd->dump_interval && !all.quiet && !all.bfgs)
  {
    size_t num_current_features = ec.num_features;
    // for csoaa_ldf we want features from the whole (multiline example),
    // not only from one line (the first one) represented by ec
    if (ec_seq != nullptr)
    {
      num_current_features = 0;
      // TODO: including quadratic and cubic.
      for (auto & ecc : *ec_seq) num_current_features += ecc->num_features;
    }

    std::string label_buf;
    if (is_test)
      label_buf = " unknown";
    else
      label_buf = " known";

    if (action_scores || all.sd->ldict)
    {
      std::ostringstream pred_buf;

      pred_buf << std::setw(all.sd->col_current_predict) << std::right << std::setfill(' ');
      if (all.sd->ldict)
      {
        if (action_scores)
          pred_buf << all.sd->ldict->get(ec.pred.a_s[0].action);
        else
          pred_buf << all.sd->ldict->get(prediction);
      }
      else
        pred_buf << ec.pred.a_s[0].action;
      if (action_scores)
        pred_buf << ".....";
      all.sd->print_update(all.holdout_set_off, all.current_pass, label_buf, pred_buf.str(), num_current_features,
          all.progress_add, all.progress_arg);
      ;
    }
    else
      all.sd->print_update(all.holdout_set_off, all.current_pass, label_buf, prediction, num_current_features,
          all.progress_add, all.progress_arg);
  }
}